

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

void test_union(_Bool copy_on_write)

{
  _Bool cow;
  roaring_bitmap_t *prVar1;
  char *file;
  byte in_DIL;
  uint32_t in_stack_0000000c;
  roaring_bitmap_t *r1_or_r2;
  uint32_t i;
  roaring_bitmap_t *r2;
  roaring_bitmap_t *r1;
  roaring_bitmap_t *in_stack_00000060;
  roaring_bitmap_t *in_stack_00000068;
  int in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint uVar2;
  
  cow = (_Bool)(in_DIL & 1);
  prVar1 = roaring_bitmap_create();
  roaring_bitmap_set_copy_on_write(prVar1,cow);
  _assert_true(CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  prVar1 = roaring_bitmap_create();
  roaring_bitmap_set_copy_on_write(prVar1,cow);
  _assert_true(CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  for (uVar2 = 0; uVar2 < 100; uVar2 = uVar2 + 1) {
    roaring_bitmap_add(r1_or_r2,in_stack_0000000c);
    roaring_bitmap_add(r1_or_r2,in_stack_0000000c);
    roaring_bitmap_get_cardinality((roaring_bitmap_t *)CONCAT44(uVar2,in_stack_ffffffffffffffe0));
    _assert_int_equal(CONCAT44(uVar2,in_stack_ffffffffffffffe0),
                      (unsigned_long)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                      in_stack_ffffffffffffffcc);
    roaring_bitmap_get_cardinality((roaring_bitmap_t *)CONCAT44(uVar2,in_stack_ffffffffffffffe0));
    _assert_int_equal(CONCAT44(uVar2,in_stack_ffffffffffffffe0),
                      (unsigned_long)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                      in_stack_ffffffffffffffcc);
  }
  prVar1 = roaring_bitmap_or(in_stack_00000068,in_stack_00000060);
  file = (char *)roaring_bitmap_get_cardinality
                           ((roaring_bitmap_t *)CONCAT44(uVar2,in_stack_ffffffffffffffe0));
  roaring_bitmap_or_cardinality
            ((roaring_bitmap_t *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),prVar1);
  _assert_true(CONCAT44(uVar2,in_stack_ffffffffffffffe0),(char *)prVar1,file,
               in_stack_ffffffffffffffcc);
  roaring_bitmap_set_copy_on_write(prVar1,cow);
  roaring_bitmap_get_cardinality((roaring_bitmap_t *)CONCAT44(uVar2,in_stack_ffffffffffffffe0));
  _assert_int_equal(CONCAT44(uVar2,in_stack_ffffffffffffffe0),(unsigned_long)prVar1,file,
                    in_stack_ffffffffffffffcc);
  roaring_bitmap_free((roaring_bitmap_t *)0x1065d5);
  roaring_bitmap_free((roaring_bitmap_t *)0x1065df);
  roaring_bitmap_free((roaring_bitmap_t *)0x1065e9);
  return;
}

Assistant:

void test_union(bool copy_on_write) {
    roaring_bitmap_t *r1 = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(r1, copy_on_write);
    assert_true(r1);
    roaring_bitmap_t *r2 = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(r2, copy_on_write);
    assert_true(r2);

    for (uint32_t i = 0; i < 100; ++i) {
        roaring_bitmap_add(r1, 2 * i);
        roaring_bitmap_add(r2, 3 * i);
        assert_int_equal(roaring_bitmap_get_cardinality(r2), i + 1);
        assert_int_equal(roaring_bitmap_get_cardinality(r1), i + 1);
    }

    roaring_bitmap_t *r1_or_r2 = roaring_bitmap_or(r1, r2);
    assert_true(roaring_bitmap_get_cardinality(r1_or_r2) ==
                roaring_bitmap_or_cardinality(r1, r2));

    roaring_bitmap_set_copy_on_write(r1_or_r2, copy_on_write);
    assert_int_equal(roaring_bitmap_get_cardinality(r1_or_r2), 166);

    roaring_bitmap_free(r1_or_r2);
    roaring_bitmap_free(r2);
    roaring_bitmap_free(r1);
}